

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tri_weighted_ideal_uv(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_uv)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  undefined1 auVar3 [16];
  double dVar4;
  REF_GEOM ref_geom;
  uint uVar5;
  undefined8 uVar6;
  int iVar7;
  REF_DBL *in_R9;
  char *pcVar8;
  int iVar9;
  REF_NODE pRVar10;
  long lVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  REF_INT id;
  REF_DBL quality;
  REF_DBL q1;
  REF_DBL q2;
  REF_DBL q;
  REF_INT geom;
  REF_DBL uv_orig [2];
  REF_DBL min_uv_area;
  REF_DBL q0;
  REF_DBL dq_dxyz [3];
  REF_INT nodes_1 [27];
  REF_DBL dxyz_duv [15];
  REF_DBL xyz [3];
  REF_INT nodes [27];
  REF_DBL *in_stack_fffffffffffffd18;
  REF_INT local_2dc;
  double local_2d8;
  double dStack_2d0;
  REF_GEOM local_2c8;
  uint local_2bc;
  double local_2b8;
  REF_INT local_2ac;
  double local_2a8;
  double local_2a0;
  double local_298;
  double dStack_290;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  REF_INT local_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  REF_NODE local_230;
  double local_228;
  double local_220;
  double local_218;
  double dStack_210;
  double local_208;
  double local_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double local_1d8;
  double dStack_1d0;
  undefined8 local_1c8;
  double dStack_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  *ideal_uv = 0.0;
  ideal_uv[1] = 0.0;
  uVar5 = ref_smooth_tri_quality_around(ref_grid,node,&local_2a8);
  if (uVar5 == 0) {
    if (local_2a8 < 0.0) {
      dVar15 = sqrt(local_2a8);
    }
    else {
      dVar15 = SQRT(local_2a8);
    }
    dVar4 = 0.0;
    if (((node < 0) || (pRVar1 = ref_grid->cell[3]->ref_adj, dVar4 = 0.0, pRVar1->nnode <= node)) ||
       (lVar11 = (long)pRVar1->first[(uint)node], dVar4 = 0.0, lVar11 == -1)) {
LAB_001dfabd:
      dVar15 = dVar4 * 1e+20;
      if (dVar15 <= -dVar15) {
        dVar15 = -dVar15;
      }
      if (1.0 < dVar15) {
        dVar15 = (1.0 / dVar4) * ideal_uv[1];
        auVar3._8_4_ = SUB84(dVar15,0);
        auVar3._0_8_ = (1.0 / dVar4) * *ideal_uv;
        auVar3._12_4_ = (int)((ulong)dVar15 >> 0x20);
        *(undefined1 (*) [16])ideal_uv = auVar3;
        return 0;
      }
      printf("normalization = %e\n",SUB84(dVar4,0));
      return 4;
    }
    pRVar10 = ref_grid->node;
    local_2ac = pRVar1->item[lVar11].ref;
    local_2c8 = ref_grid->geom;
    local_228 = dVar15;
    uVar5 = ref_cell_nodes(ref_grid->cell[3],local_2ac,&local_1b8);
    if (uVar5 == 0) {
      uVar13 = 0;
      uVar14 = 0;
      do {
        ref_geom = local_2c8;
        iVar9 = -1;
        if (local_1b8 == node) {
          iVar9 = local_1b0;
        }
        iVar7 = -1;
        if (local_1b8 == node) {
          iVar7 = local_1b4;
        }
        if (local_1b4 == node) {
          iVar7 = local_1b0;
          iVar9 = local_1b8;
        }
        if (local_1b0 == node) {
          iVar7 = local_1b8;
          iVar9 = local_1b4;
        }
        if ((iVar7 == -1) || (iVar9 == -1)) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x1a3,"ref_smooth_tri_ideal_uv","empty triangle side");
          uVar12 = 1;
          goto LAB_001df383;
        }
        local_280 = (double)CONCAT44(uVar14,uVar13);
        local_230 = pRVar10;
        local_1b8 = node;
        local_1b4 = iVar7;
        local_1b0 = iVar9;
        uVar5 = ref_geom_unique_id(local_2c8,node,2,&local_2dc);
        if (uVar5 != 0) {
          uVar12 = (ulong)uVar5;
          pcVar8 = "id";
          uVar6 = 0x1a9;
          goto LAB_001df379;
        }
        uVar5 = ref_geom_tuv(ref_geom,node,2,local_2dc,&local_218);
        if (uVar5 != 0) {
          uVar12 = (ulong)uVar5;
          pcVar8 = "uv";
          uVar6 = 0x1aa;
          goto LAB_001df379;
        }
        uVar5 = ref_geom_find(ref_geom,node,2,local_2dc,&local_25c);
        if (uVar5 != 0) {
          uVar12 = (ulong)uVar5;
          pcVar8 = "geom";
          uVar6 = 0x1ab;
          goto LAB_001df379;
        }
        uVar5 = ref_node_tri_quality(local_230,&local_1b8,&local_200);
        if (uVar5 != 0) {
          uVar12 = (ulong)uVar5;
          pcVar8 = "qual";
          uVar6 = 0x1af;
          goto LAB_001df379;
        }
        local_2d8 = local_218;
        dStack_2d0 = dStack_210;
        local_268 = local_200;
        if (local_200 < local_228) {
          local_2bc = 0;
          uVar13 = 0;
          uVar14 = 0;
          dVar15 = 0.0;
          do {
            local_2b8 = (double)CONCAT44(uVar14,uVar13);
            local_298 = dVar15;
            uVar5 = ref_geom_add(local_2c8,node,2,local_2dc,&local_2d8);
            if (uVar5 != 0) {
              uVar12 = (ulong)uVar5;
              pcVar8 = "set uv";
              uVar6 = 0x1b7;
              goto LAB_001df379;
            }
            uVar5 = ref_smooth_tri_uv_area_around(ref_grid,node,&local_208);
            pRVar10 = local_230;
            if (uVar5 != 0) {
              uVar12 = (ulong)uVar5;
              pcVar8 = "min area";
              uVar6 = 0x1b9;
              goto LAB_001df379;
            }
            if (local_208 <= local_230->min_uv_area) {
              local_2d8 = local_218;
              dStack_2d0 = dStack_210;
              break;
            }
            uVar5 = ref_geom_constrain(ref_grid,node);
            if (uVar5 != 0) {
              uVar12 = (ulong)uVar5;
              pcVar8 = "constrain";
              uVar6 = 0x1c0;
              goto LAB_001df379;
            }
            uVar5 = ref_node_tri_dquality_dnode0(pRVar10,&local_1b8,&local_268,&local_1f8);
            if (uVar5 != 0) {
              uVar12 = (ulong)uVar5;
              pcVar8 = "qual";
              uVar6 = 0x1c1;
              goto LAB_001df379;
            }
            uVar5 = ref_egads_eval(local_2c8,local_25c,local_c8,&local_148);
            if (uVar5 != 0) {
              uVar12 = (ulong)uVar5;
              pcVar8 = "eval face";
              uVar6 = 0x1c2;
              goto LAB_001df379;
            }
            local_1c8 = local_120 * local_1e8 + local_130 * local_1f8 + dStack_128 * dStack_1f0;
            local_1d8 = local_138 * local_1e8 + local_148 * local_1f8 + local_140 * dStack_1f0;
            dVar15 = local_1c8;
            dVar4 = local_1d8;
            if (local_2bc != 0) {
              dVar15 = (local_1d8 - local_298) * local_1d8 + (local_1c8 - local_2b8) * local_1c8;
              dVar4 = local_298 * local_298 + local_2b8 * local_2b8;
              auVar16._0_8_ = dVar4 * 1e+20;
              auVar16._8_8_ = dVar15;
              auVar17._8_4_ = SUB84(dVar15,0);
              auVar17._0_8_ = -auVar16._0_8_;
              auVar17._12_4_ = (uint)((ulong)dVar15 >> 0x20) ^ 0x80000000;
              auVar17 = maxpd(auVar16,auVar17);
              dVar15 = (double)(-(ulong)(auVar17._8_8_ < auVar17._0_8_) & (ulong)(dVar15 / dVar4));
              uVar13 = 0;
              uVar14 = 0;
              if (0.0 <= dVar15) {
                uVar13 = SUB84(dVar15,0);
                uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
              }
              dVar15 = (double)CONCAT44(uVar14,uVar13) * (double)local_258._0_8_ + local_1c8;
              dVar4 = (double)CONCAT44(uVar14,uVar13) * (double)local_258._8_8_ + local_1d8;
            }
            uVar13 = (undefined4)((ulong)dVar4 >> 0x20);
            local_248._8_4_ = SUB84(dVar4,0);
            local_248._0_8_ = dVar15;
            local_248._12_4_ = uVar13;
            local_278 = (1.0 - local_268) / SQRT(dVar4 * dVar4 + dVar15 * dVar15);
            local_298 = (local_278 + 0.0) * 0.5;
            local_258._8_4_ = SUB84(dVar4,0);
            local_258._0_8_ = dVar4;
            local_258._12_4_ = uVar13;
            dStack_1d0 = local_1d8;
            dStack_1c0 = local_1d8;
            uVar5 = ref_smooth_tri_quality
                              (ref_grid,node,local_2dc,&local_1b8,&local_2a0,in_R9,local_2d8,
                               in_stack_fffffffffffffd18);
            if (uVar5 != 0) {
              uVar12 = (ulong)uVar5;
              pcVar8 = "set uv for q1";
              uVar6 = 0x1e3;
              goto LAB_001df379;
            }
            uVar5 = ref_smooth_tri_quality
                              (ref_grid,node,local_2dc,&local_1b8,&local_270,in_R9,local_2d8,
                               in_stack_fffffffffffffd18);
            if (uVar5 != 0) {
              uVar12 = (ulong)uVar5;
              pcVar8 = "set uv for q2";
              uVar6 = 0x1e6;
              goto LAB_001df379;
            }
            uVar5 = ref_smooth_tri_quality
                              (ref_grid,node,local_2dc,&local_1b8,&local_220,in_R9,local_2d8,
                               in_stack_fffffffffffffd18);
            if (uVar5 != 0) {
              uVar12 = (ulong)uVar5;
              pcVar8 = "set uv for q3";
              uVar6 = 0x1e9;
              goto LAB_001df379;
            }
            local_2b8 = 0.0;
            iVar9 = 0xf;
            do {
              if (local_2a0 <= local_220) {
                local_2a0 = local_270;
                uVar13 = SUB84(local_298,0);
                uVar14 = (undefined4)((ulong)local_298 >> 0x20);
              }
              else {
                local_220 = local_270;
                local_278 = local_298;
                uVar13 = SUB84(local_2b8,0);
                uVar14 = (undefined4)((ulong)local_2b8 >> 0x20);
              }
              local_2b8 = (double)CONCAT44(uVar14,uVar13);
              local_298 = (local_278 + (double)CONCAT44(uVar14,uVar13)) * 0.5;
              uVar5 = ref_smooth_tri_quality
                                (ref_grid,node,local_2dc,&local_1b8,&local_270,in_R9,local_2d8,
                                 in_stack_fffffffffffffd18);
              if (uVar5 != 0) {
                uVar12 = (ulong)uVar5;
                pcVar8 = "set uv for q2";
                uVar6 = 0x1f5;
                goto LAB_001df379;
              }
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
            if (local_270 < local_2a0) {
              uVar5 = ref_smooth_tri_quality
                                (ref_grid,node,local_2dc,&local_1b8,&local_2a0,in_R9,local_2d8,
                                 in_stack_fffffffffffffd18);
              if (uVar5 != 0) {
                uVar12 = (ulong)uVar5;
                pcVar8 = "set uv for q1";
                uVar6 = 0x1fa;
                goto LAB_001df379;
              }
              uVar5 = ref_geom_tuv(local_2c8,node,2,local_2dc,&local_2d8);
              if (uVar5 != 0) {
                uVar12 = (ulong)uVar5;
                pcVar8 = "uv";
                uVar6 = 0x1fb;
                goto LAB_001df379;
              }
              break;
            }
            uVar5 = ref_geom_tuv(local_2c8,node,2,local_2dc,&local_2d8);
            if (uVar5 != 0) {
              uVar12 = (ulong)uVar5;
              pcVar8 = "uv";
              uVar6 = 0x1fe;
              goto LAB_001df379;
            }
            if (0x1c < local_2bc) break;
            local_2bc = local_2bc + 1;
            local_258 = local_248;
            uVar13 = (undefined4)local_1c8;
            uVar14 = local_1c8._4_4_;
            dVar15 = local_1d8;
          } while (local_268 < local_228);
        }
        uVar5 = ref_geom_add(local_2c8,node,2,local_2dc,&local_218);
        if (uVar5 != 0) {
          uVar12 = (ulong)uVar5;
          pcVar8 = "set uv";
          uVar6 = 0x20c;
          goto LAB_001df379;
        }
        uVar5 = ref_geom_constrain(ref_grid,node);
        if (uVar5 != 0) {
          uVar12 = (ulong)uVar5;
          pcVar8 = "constrain";
          uVar6 = 0x20d;
          goto LAB_001df379;
        }
        local_298 = local_2d8;
        dStack_290 = dStack_2d0;
        uVar5 = ref_cell_nodes(ref_grid->cell[3],local_2ac,local_a8);
        if (uVar5 != 0) {
          uVar12 = (ulong)uVar5;
          pcVar8 = "nodes";
          uVar6 = 0x29a;
          goto LAB_001df2b0;
        }
        uVar5 = ref_node_tri_quality(ref_grid->node,local_a8,&local_2a8);
        if (uVar5 != 0) {
          uVar12 = (ulong)uVar5;
          pcVar8 = "tri qual";
          uVar6 = 0x29c;
          goto LAB_001df2b0;
        }
        uVar13 = SUB84(local_2a8,0);
        uVar14 = (undefined4)((ulong)local_2a8 >> 0x20);
        dVar15 = ref_grid->adapt->smooth_min_quality;
        if (local_2a8 <= dVar15) {
          uVar13 = SUB84(dVar15,0);
          uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
        }
        local_2a8 = (double)CONCAT44(uVar14,uVar13);
        dVar15 = 1.0 / (double)CONCAT44(uVar14,uVar13);
        dVar4 = local_280 + dVar15;
        *ideal_uv = dVar15 * local_298 + *ideal_uv;
        ideal_uv[1] = dVar15 * dStack_290 + ideal_uv[1];
        pRVar2 = ref_grid->cell[3]->ref_adj->item;
        lVar11 = (long)pRVar2[(int)lVar11].next;
        if (lVar11 == -1) goto LAB_001dfabd;
        local_2ac = pRVar2[lVar11].ref;
        pRVar10 = ref_grid->node;
        local_2c8 = ref_grid->geom;
        local_280 = dVar4;
        uVar5 = ref_cell_nodes(ref_grid->cell[3],local_2ac,&local_1b8);
        uVar13 = SUB84(local_280,0);
        uVar14 = (undefined4)((ulong)local_280 >> 0x20);
      } while (uVar5 == 0);
    }
    uVar12 = (ulong)uVar5;
    pcVar8 = "get tri";
    uVar6 = 0x193;
LAB_001df379:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar6,
           "ref_smooth_tri_ideal_uv",uVar12,pcVar8);
LAB_001df383:
    pcVar8 = "tri ideal";
    uVar6 = 0x299;
  }
  else {
    uVar12 = (ulong)uVar5;
    pcVar8 = "q";
    uVar6 = 0x294;
  }
LAB_001df2b0:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar6,
         "ref_smooth_tri_weighted_ideal_uv",uVar12,pcVar8);
  return (REF_STATUS)uVar12;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_weighted_ideal_uv(REF_GRID ref_grid,
                                                           REF_INT node,
                                                           REF_DBL *ideal_uv) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT iuv;
  REF_DBL tri_uv[2];
  REF_DBL target_q, quality, weight, normalization;

  normalization = 0.0;
  for (iuv = 0; iuv < 2; iuv++) ideal_uv[iuv] = 0.0;

  RSS(ref_smooth_tri_quality_around(ref_grid, node, &quality), "q");
  target_q = sqrt(quality);

  each_ref_cell_having_node(ref_grid_tri(ref_grid), node, item, cell) {
    RSS(ref_smooth_tri_ideal_uv(ref_grid, node, cell, tri_uv, target_q),
        "tri ideal");
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tri qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (iuv = 0; iuv < 2; iuv++) ideal_uv[iuv] += weight * tri_uv[iuv];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (iuv = 0; iuv < 2; iuv++)
      ideal_uv[iuv] = (1.0 / normalization) * ideal_uv[iuv];
  } else {
    printf("normalization = %e\n", normalization);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}